

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

void __thiscall sptk::Matrix::~Matrix(Matrix *this)

{
  Matrix *in_RDI;
  
  ~Matrix(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Matrix() {
  }